

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsSetException(JsValueRef exception)

{
  ScriptContext *scriptContext;
  JsrtRuntime *pJVar1;
  ScriptContext *pSVar2;
  JsrtContext *pJVar3;
  RecyclableObject *value;
  Recycler *alloc;
  JavascriptExceptionObject *this;
  JsErrorCode JVar4;
  undefined1 local_90 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&data.line,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pJVar3 = JsrtContext::GetCurrent();
  pJVar1 = (pJVar3->runtime).ptr;
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTSetException
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               exception,pJVar1->dispatchExceptions);
  }
  if (exception == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)exception >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(exception);
      pSVar2 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar2 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar2->threadContext != scriptContext->threadContext) goto LAB_0037f08f;
        exception = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    local_90 = (undefined1  [8])&Js::JavascriptExceptionObject::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_18244a;
    data.filename._0_4_ = 0xcab;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_90);
    this = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,alloc,0x387914);
    JVar4 = JsNoError;
    Js::JavascriptExceptionObject::JavascriptExceptionObject
              (this,exception,scriptContext,(JavascriptExceptionContext *)0x0,false);
    Js::ScriptContext::RecordException(scriptContext,this,pJVar1->dispatchExceptions);
  }
LAB_0037f08f:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&data.line);
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsSetException(_In_ JsValueRef exception)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        JsrtContext * context = JsrtContext::GetCurrent();
        JsrtRuntime * runtime = context->GetRuntime();

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetException, exception, runtime->DispatchExceptions());

        VALIDATE_INCOMING_REFERENCE(exception, scriptContext);

        Js::JavascriptExceptionObject *exceptionObject;
        exceptionObject = RecyclerNew(scriptContext->GetRecycler(), Js::JavascriptExceptionObject, exception, scriptContext, nullptr);

        scriptContext->RecordException(exceptionObject, runtime->DispatchExceptions());

        return JsNoError;
    });
}